

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gdscpp::findRootSTR(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   gdscpp *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference puVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  uint *local_48;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  iterator fooVec;
  uint local_28;
  uint local_24;
  uint k;
  uint j;
  uint i;
  bool vecFound;
  gdscpp *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *rootSTRindexes;
  
  _i = this;
  this_local = (gdscpp *)__return_storage_ptr__;
  poVar3 = std::operator<<((ostream *)&std::cout,"Finding the root structures.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  j._3_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  k = 0;
  do {
    uVar4 = (ulong)k;
    sVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::size(&this->STR);
    if (sVar5 <= uVar4) {
      std::operator<<((ostream *)&std::cout,"Root GDS structures: ");
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      __normal_iterator(&local_40);
      local_48 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   (__return_storage_ptr__);
      local_40._M_current = local_48;
      while( true ) {
        local_50._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (__return_storage_ptr__);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
        if (!bVar1) break;
        poVar3 = std::operator<<((ostream *)&std::cout,"  ");
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_40);
        pvVar6 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(ulong)*puVar8)
        ;
        std::operator<<(poVar3,(string *)pvVar6);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_40,0);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return __return_storage_ptr__;
    }
    j._2_1_ = 0;
    for (local_24 = 0; sVar5 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::size(&this->STR),
        local_24 < sVar5; local_24 = local_24 + 1) {
      local_28 = 0;
      while( true ) {
        pvVar6 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                           (&this->STR,(ulong)local_24);
        sVar5 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::size(&pvVar6->SREF);
        if (sVar5 <= local_28) break;
        pvVar6 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(ulong)k);
        pvVar7 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                           (&this->STR,(ulong)local_24);
        std::vector<gdsSREF,_std::allocator<gdsSREF>_>::operator[](&pvVar7->SREF,(ulong)local_28);
        iVar2 = std::__cxx11::string::compare((string *)pvVar6);
        if (iVar2 == 0) {
          j._2_1_ = 1;
          break;
        }
        local_28 = local_28 + 1;
      }
      if ((j._2_1_ & 1) != 0) break;
    }
    if ((j._2_1_ & 1) == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(__return_storage_ptr__,&k)
      ;
    }
    k = k + 1;
  } while( true );
}

Assistant:

vector<unsigned int> gdscpp::findRootSTR()
{
  cout << "Finding the root structures." << endl;

  vector<unsigned int> rootSTRindexes;
  bool vecFound;

  for (unsigned int i = 0; i < this->STR.size(); i++) {
    vecFound = false;
    for (unsigned int j = 0; j < this->STR.size(); j++) {
      for (unsigned int k = 0; k < this->STR[j].SREF.size(); k++) {
        if (!this->STR[i].name.compare(this->STR[j].SREF[k].name)) {
          vecFound = true;
          break;
        }
      }
      if (vecFound) {
        break;
      }
    }
    if (vecFound == false) {
      rootSTRindexes.push_back(i);
    }
  }

  // display the root GDS STR
  cout << "Root GDS structures: ";

  vector<unsigned int>::iterator fooVec;
  for (fooVec = rootSTRindexes.begin(); fooVec != rootSTRindexes.end();
       fooVec++) {
    cout << "  " << this->STR[*fooVec].name;
  }
  cout << endl;

  return rootSTRindexes;
}